

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void action_key(tgestate_t *state,room_t room_of_key)

{
  byte *pbVar1;
  byte in_SIL;
  tgestate_t *in_RDI;
  tgestate_t *in_stack_00000008;
  message_t message;
  doorindex_t *pdoor;
  undefined4 local_1c;
  
  pbVar1 = get_nearest_door(in_stack_00000008);
  if (pbVar1 != (byte *)0x0) {
    if ((*pbVar1 & 0x7f) == in_SIL) {
      *pbVar1 = *pbVar1 & 0x7f;
      increase_morale_by_10_score_by_50((tgestate_t *)0x10e075);
      local_1c = message_IT_IS_OPEN;
    }
    else {
      local_1c = message_INCORRECT_KEY;
    }
    queue_message(in_RDI,local_1c);
  }
  return;
}

Assistant:

void action_key(tgestate_t *state, room_t room_of_key)
{
  doorindex_t *pdoor;   /* was HL */
  message_t    message; /* was B */

  assert(state != NULL);
  ASSERT_ROOM_VALID(room_of_key);

  pdoor = get_nearest_door(state);
  if (pdoor == NULL)
    return; /* No door nearby. */

  if ((*pdoor & ~door_LOCKED) != room_of_key)
  {
    message = message_INCORRECT_KEY;
  }
  else
  {
    *pdoor &= ~door_LOCKED; /* Unlock. */
    increase_morale_by_10_score_by_50(state);
    message = message_IT_IS_OPEN;
  }

  queue_message(state, message);
}